

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

Value __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::makeNumberCheck
          (Interpreter *this,LocationRange *loc,double v)

{
  uint uVar1;
  undefined8 uVar2;
  LocationRange *loc_00;
  Interpreter *in_RSI;
  Interpreter *in_RDI;
  double in_XMM0_Qa;
  Value VVar3;
  string *in_stack_ffffffffffffff38;
  LocationRange *in_stack_ffffffffffffff40;
  Interpreter *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffff7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  
  uVar1 = std::isnan(in_XMM0_Qa);
  if ((uVar1 & 1) != 0) {
    uVar2 = __cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,
               (char *)CONCAT17(in_stack_ffffffffffffff7f,
                                CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),
               (allocator<char> *)in_RDI);
    makeError(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    __cxa_throw(uVar2,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  uVar1 = std::isinf(in_XMM0_Qa);
  if ((uVar1 & 1) == 0) {
    VVar3 = makeNumber(in_RDI,in_XMM0_Qa);
    VVar3._4_4_ = 0;
    return VVar3;
  }
  uVar4 = 1;
  loc_00 = (LocationRange *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,
             (char *)CONCAT17(in_stack_ffffffffffffff7f,CONCAT16(uVar4,in_stack_ffffffffffffff78)),
             (allocator<char> *)in_RDI);
  makeError(in_RSI,loc_00,in_stack_ffffffffffffff38);
  __cxa_throw(loc_00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

Value makeNumberCheck(const LocationRange &loc, double v)
    {
        if (std::isnan(v)) {
            throw makeError(loc, "not a number");
        }
        if (std::isinf(v)) {
            throw makeError(loc, "overflow");
        }
        return makeNumber(v);
    }